

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_open_input_file_descriptor(sexp ctx,sexp self,sexp_sint_t n,sexp fileno,sexp shutdownp)

{
  undefined8 uVar1;
  sexp self_00;
  sexp in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined1 *in_R8;
  sexp unaff_retaddr;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp str;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp str_00;
  sexp in_stack_ffffffffffffffa8;
  sexp_gc_var_t *n_00;
  char *ms;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 uVar2;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 in_stack_fffffffffffffff8;
  
  local_38 = 0x43e;
  local_30 = in_R8;
  local_28 = in_RCX;
  memset(&stack0xffffffffffffffb8,0,0x10);
  ms = &DAT_0000043e;
  memset(&stack0xffffffffffffffa0,0,0x10);
  if (((local_28 & 3) == 0) && (((sexp)local_28)->tag == 0x12)) {
    if ((((sexp)local_28)->value).fileno.fd < 0) {
      uVar1 = sexp_file_exception((sexp)in_stack_ffffffffffffffc0,(sexp)in_stack_ffffffffffffffb8,ms
                                  ,in_stack_ffffffffffffffa8);
    }
    else {
      uVar1 = &stack0xffffffffffffffc8;
      uVar2 = (((sexp)in_RDI)->value).context.saves;
      (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffb8;
      str_00 = (sexp)&stack0xffffffffffffffb0;
      n_00 = (((sexp)in_RDI)->value).context.saves;
      (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffa0;
      self_00 = sexp_make_string_op((sexp)__sexp_gc_preserver2.var,unaff_retaddr,
                                    in_stack_fffffffffffffff8,(sexp)in_RDI,(sexp)in_RSI);
      uVar1 = sexp_open_input_string_op((sexp)uVar1,self_00,(sexp_sint_t)n_00,str_00);
      if (((uVar1 & 3) != 0) || (((sexp)uVar1)->tag != 0x13)) {
        (((sexp)uVar1)->value).type.slots = (sexp)local_28;
        (((sexp)uVar1)->value).port.offset = 0x1000;
        (((sexp)uVar1)->value).flonum_bits[0x2a] = '\x01';
        (((sexp)uVar1)->value).flonum_bits[0x2b] = (sexp)local_30 != (sexp)&DAT_0000003e;
        (((sexp)local_28)->value).type.slots =
             (sexp)((long)&((((sexp)local_28)->value).type.slots)->tag + 1);
      }
      (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)uVar2;
    }
  }
  else {
    uVar1 = sexp_type_exception((sexp)in_stack_ffffffffffffffc0,(sexp)in_stack_ffffffffffffffb8,
                                (sexp_uint_t)ms,in_stack_ffffffffffffffa8);
  }
  return (sexp)uVar1;
}

Assistant:

sexp sexp_open_input_file_descriptor (sexp ctx, sexp self, sexp_sint_t n, sexp fileno, sexp shutdownp) {
  sexp_gc_var2(res, str);
  sexp_assert_type(ctx, sexp_filenop, SEXP_FILENO, fileno);
  if (sexp_fileno_fd(fileno) < 0)
    return sexp_file_exception(ctx, self, "invalid file descriptor", fileno);
  sexp_gc_preserve2(ctx, res, str);
  str = sexp_make_string(ctx, sexp_make_fixnum(SEXP_PORT_BUFFER_SIZE), SEXP_VOID);
  res = sexp_open_input_string(ctx, str);
  if (!sexp_exceptionp(res)) {
    sexp_port_fd(res) = fileno;
    sexp_port_offset(res) = SEXP_PORT_BUFFER_SIZE;
    sexp_port_binaryp(res) = 1;
    sexp_port_shutdownp(res) = sexp_truep(shutdownp);
    sexp_fileno_count(fileno)++;
  }
  sexp_gc_release2(ctx);
  return res;
}